

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_Sobel(SobelForm1 Sobel)

{
  bool bVar1;
  Image output;
  Image input;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  bVar1 = true;
  if ((2 < input._width) && (2 < input._height)) {
    (*Sobel)(&output,&input);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>(&input,&output);
    if (bVar1) {
      bVar1 = Unit_Test::verifyImage(&output,'\0');
    }
    else {
      bVar1 = false;
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar1;
}

Assistant:

bool form1_Sobel(SobelForm1 Sobel)
    {
        const PenguinV_Image::Image input = uniformImage();
        if ( (input.width() < 3) || (input.height() < 3) )
            return true;

        const PenguinV_Image::Image output = Sobel( input );

        return equalSize( input, output ) && verifyImage( output, 0u );
    }